

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O0

target_ulong_conflict pmpaddr_csr_read_riscv32(CPURISCVState_conflict *env,uint32_t addr_index)

{
  target_ulong_conflict local_18;
  target_ulong_conflict val;
  uint32_t addr_index_local;
  CPURISCVState_conflict *env_local;
  
  local_18 = 0;
  if (addr_index < 0x10) {
    local_18 = (env->pmp_state).pmp[addr_index].addr_reg;
  }
  return local_18;
}

Assistant:

target_ulong pmpaddr_csr_read(CPURISCVState *env, uint32_t addr_index)
{
    target_ulong val = 0;

    if (addr_index < MAX_RISCV_PMPS) {
        val = env->pmp_state.pmp[addr_index].addr_reg;
    } else {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpaddr read - out of bounds\n");
    }

    return val;
}